

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

NFRule * __thiscall icu_63::NFRuleSet::findNormalRule(NFRuleSet *this,int64_t number)

{
  UBool UVar1;
  uint32_t index;
  NFRule *pNVar2;
  int64_t iVar3;
  NFRuleSet *local_38;
  NFRule *result;
  int local_28;
  int32_t mid;
  int32_t lo;
  int32_t hi;
  int64_t number_local;
  NFRuleSet *this_local;
  
  if (this->fIsFractionRuleSet == '\0') {
    _lo = number;
    if (number < 0) {
      if (this->nonNumericalRules[0] != (NFRule *)0x0) {
        return this->nonNumericalRules[0];
      }
      _lo = -number;
    }
    index = NFRuleList::size(&this->rules);
    if ((int)index < 1) {
      this_local = (NFRuleSet *)this->nonNumericalRules[3];
    }
    else {
      local_28 = 0;
      while (mid = index, local_28 < mid) {
        index = (local_28 + mid) / 2;
        pNVar2 = NFRuleList::operator[](&this->rules,index);
        iVar3 = NFRule::getBaseValue(pNVar2);
        if (iVar3 == _lo) {
          pNVar2 = NFRuleList::operator[](&this->rules,index);
          return pNVar2;
        }
        pNVar2 = NFRuleList::operator[](&this->rules,index);
        iVar3 = NFRule::getBaseValue(pNVar2);
        if (iVar3 <= _lo) {
          local_28 = index + 1;
          index = mid;
        }
      }
      if (mid == 0) {
        this_local = (NFRuleSet *)0x0;
      }
      else {
        local_38 = (NFRuleSet *)NFRuleList::operator[](&this->rules,mid - 1);
        UVar1 = NFRule::shouldRollBack((NFRule *)local_38,_lo);
        if (UVar1 != '\0') {
          if (mid == 1) {
            return (NFRule *)0x0;
          }
          local_38 = (NFRuleSet *)NFRuleList::operator[](&this->rules,mid - 2);
        }
        this_local = local_38;
      }
    }
  }
  else {
    this_local = (NFRuleSet *)findFractionRuleSetRule(this,(double)number);
  }
  return (NFRule *)this_local;
}

Assistant:

const NFRule *
NFRuleSet::findNormalRule(int64_t number) const
{
    // if this is a fraction rule set, use findFractionRuleSetRule()
    // to find the rule (we should only go into this clause if the
    // value is 0)
    if (fIsFractionRuleSet) {
        return findFractionRuleSetRule((double)number);
    }

    // if the number is negative, return the negative-number rule
    // (if there isn't one, pretend the number is positive)
    if (number < 0) {
        if (nonNumericalRules[NEGATIVE_RULE_INDEX]) {
            return nonNumericalRules[NEGATIVE_RULE_INDEX];
        } else {
            number = -number;
        }
    }

    // we have to repeat the preceding two checks, even though we
    // do them in findRule(), because the version of format() that
    // takes a long bypasses findRule() and goes straight to this
    // function.  This function does skip the fraction rules since
    // we know the value is an integer (it also skips the master
    // rule, since it's considered a fraction rule.  Skipping the
    // master rule in this function is also how we avoid infinite
    // recursion)

    // {dlf} unfortunately this fails if there are no rules except
    // special rules.  If there are no rules, use the master rule.

    // binary-search the rule list for the applicable rule
    // (a rule is used for all values from its base value to
    // the next rule's base value)
    int32_t hi = rules.size();
    if (hi > 0) {
        int32_t lo = 0;

        while (lo < hi) {
            int32_t mid = (lo + hi) / 2;
            if (rules[mid]->getBaseValue() == number) {
                return rules[mid];
            }
            else if (rules[mid]->getBaseValue() > number) {
                hi = mid;
            }
            else {
                lo = mid + 1;
            }
        }
        if (hi == 0) { // bad rule set, minimum base > 0
            return NULL; // want to throw exception here
        }

        NFRule *result = rules[hi - 1];

        // use shouldRollBack() to see whether we need to invoke the
        // rollback rule (see shouldRollBack()'s documentation for
        // an explanation of the rollback rule).  If we do, roll back
        // one rule and return that one instead of the one we'd normally
        // return
        if (result->shouldRollBack(number)) {
            if (hi == 1) { // bad rule set, no prior rule to rollback to from this base
                return NULL;
            }
            result = rules[hi - 2];
        }
        return result;
    }
    // else use the master rule
    return nonNumericalRules[MASTER_RULE_INDEX];
}